

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_mtdf.c
# Opt level: O0

short SEARCH_mtdf_iterative(chess_state_t *s,search_state_t *search_state,move_t *move)

{
  int iVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  int64_t iVar5;
  int local_5e4;
  int local_5e0;
  int local_5d8;
  int local_5d0;
  move_t pv_move;
  int i;
  int pv_length;
  int promotion_type [100];
  int pos_to [100];
  int pos_from [100];
  short r2;
  short r1;
  int64_t time_passed_ms;
  move_t m;
  short sStack_f4;
  short guess;
  short results [101];
  byte local_21;
  uchar depth;
  move_t *move_local;
  search_state_t *search_state_local;
  chess_state_t *s_local;
  
  time_passed_ms._0_4_ = 0;
  memset(search_state->history_heuristic,0,0x8000);
  if (100 < search_state->max_depth) {
    search_state->max_depth = 'd';
  }
  (search_state->pv).size = 0;
  m._0_2_ = SEARCH_mtdf(s,search_state,'\0',(move_t *)&time_passed_ms,0);
  *move = (move_t)time_passed_ms;
  local_21 = 1;
  do {
    if (search_state->max_depth < local_21) {
LAB_001062eb:
      if (search_state->max_depth < local_21) {
        local_21 = search_state->max_depth;
      }
      return *(short *)((long)&m + (ulong)local_21 * 2);
    }
    time_passed_ms._6_2_ = *(short *)((long)&m + (long)(int)(local_21 - 1) * 2);
    if (2 < local_21) {
      sVar3 = *(short *)((long)&m + (long)(int)(local_21 - 1) * 2) -
              *(short *)((long)&m + (long)(int)(local_21 - 2) * 2);
      sVar4 = *(short *)((long)&m + (long)(int)(local_21 - 1) * 2) -
              *(short *)((long)&m + (long)(int)(local_21 - 3) * 2);
      if (sVar4 < 0) {
        local_5d8 = -(int)sVar4;
      }
      else {
        local_5d8 = (int)sVar4;
      }
      if (sVar3 < 0) {
        local_5e0 = -(int)sVar3;
      }
      else {
        local_5e0 = (int)sVar3;
      }
      if (local_5d8 < local_5e0) {
        time_passed_ms._6_2_ = *(short *)((long)&m + (long)(int)(local_21 - 2) * 2);
      }
    }
    sVar3 = SEARCH_mtdf(s,search_state,local_21,(move_t *)&time_passed_ms,time_passed_ms._6_2_);
    *(short *)((long)&m + (ulong)local_21 * 2) = sVar3;
    if (search_state->abort_search != 0) {
      local_21 = local_21 - 1;
      goto LAB_001062eb;
    }
    *move = (move_t)time_passed_ms;
    iVar5 = CLOCK_time_passed(search_state->start_time_ms);
    if (search_state->think_cb != (thinking_output_cb)0x0) {
      iVar1 = (search_state->pv).size;
      for (local_5d0 = 0; local_5d0 < iVar1; local_5d0 = local_5d0 + 1) {
        uVar2 = (search_state->pv).moves[local_5d0];
        pos_to[(long)local_5d0 + 0x62] = uVar2 & 0x3f;
        promotion_type[(long)local_5d0 + 0x62] = (uVar2 & 0xfc0) >> 6;
        if (((uVar2 & 0x3c0000) >> 0x12 & 8) == 0) {
          local_5e4 = 0;
        }
        else {
          local_5e4 = ((uVar2 & 0x3c0000) >> 0x12 & 0xb) - 7;
        }
        (&i)[local_5d0] = local_5e4;
      }
      (*search_state->think_cb)
                ((int)local_21,*(short *)((long)&m + (ulong)local_21 * 2) * 5,(int)iVar5,
                 search_state->num_nodes_searched,iVar1,pos_to + 0x62,promotion_type + 0x62,&i);
    }
    if (((*(short *)((long)&m + (ulong)local_21 * 2) < -999) ||
        (999 < *(short *)((long)&m + (ulong)local_21 * 2))) ||
       (iVar5 * 2 - search_state->time_for_move_ms != 0 &&
        search_state->time_for_move_ms <= iVar5 * 2)) goto LAB_001062eb;
    local_21 = local_21 + 1;
  } while( true );
}

Assistant:

short SEARCH_mtdf_iterative(const chess_state_t *s, search_state_t *search_state, move_t *move)
{
    unsigned char depth;
    short results[MAX_SEARCH_DEPTH+1];
    short guess;
    move_t m;
    int64_t time_passed_ms = 0;
    m = 0;

    /* Clear history heuristic */
    memset(search_state->history_heuristic, 0, sizeof(search_state->history_heuristic));
    
    /* Limit maximum search depth */
    if(search_state->max_depth > MAX_SEARCH_DEPTH) search_state->max_depth = MAX_SEARCH_DEPTH;

    search_state->pv.size = 0;
    
    results[0] = SEARCH_mtdf(s, search_state, 0, &m, 0);
    *move = m;
    
    for(depth = 1; depth <= search_state->max_depth; depth++) {
        
        /* If results oscillate between depths, let guess be the result from two depths back */ 
        guess = results[depth-1];
        if(depth >= 3) {
            short r1 = results[depth-1] - results[depth-2];
            short r2 = results[depth-1] - results[depth-3];
            if(abs(r2) < abs(r1)) {
                guess = results[depth-2];
            }
        }
        
        results[depth] = SEARCH_mtdf(s, search_state, depth, &m, guess);
        
        if(search_state->abort_search) {
            depth--;
            break;
        }
        
        *move = m;
        
        time_passed_ms = CLOCK_time_passed(search_state->start_time_ms);
        if(search_state->think_cb) {
            int pos_from[MAX_SEARCH_DEPTH];
            int pos_to[MAX_SEARCH_DEPTH];
            int promotion_type[MAX_SEARCH_DEPTH];
            int pv_length = search_state->pv.size;
            for(int i = 0; i < pv_length; i++) {
                move_t pv_move = search_state->pv.moves[i];
                pos_from[i] = MOVE_GET_POS_FROM(pv_move);
                pos_to[i] = MOVE_GET_POS_TO(pv_move);
                promotion_type[i] = MOVE_PROMOTION_TYPE(pv_move);
            }
            (*search_state->think_cb)(depth, 5 * (int)results[depth], (int)time_passed_ms, search_state->num_nodes_searched, pv_length, pos_from, pos_to, promotion_type);
        }

        /* No need to search deeper if checkmate is detected */
        if(results[depth] <= SEARCH_MIN_RESULT(0) || results[depth] >= SEARCH_MAX_RESULT(0)) {
            break;
        }

        if(2 * time_passed_ms > search_state->time_for_move_ms) {
            break;
        }
    }
    
    /* If maximum search depth is reached */
    if(depth > search_state->max_depth) depth = search_state->max_depth;
    
    return results[depth];
}